

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O2

bool __thiscall node::Warnings::Set(Warnings *this,warning_type id,bilingual_str message)

{
  bilingual_str *in_RDX;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_bool>
  pVar1;
  warning_type id_local;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str> local_70;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock0,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/warnings.cpp"
             ,0x1f,false);
  std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>::
  pair<std::variant<kernel::Warning,_node::Warning>_&,_bilingual_str,_true>
            (&local_70,&id_local,in_RDX);
  pVar1 = std::
          _Rb_tree<std::variant<kernel::Warning,node::Warning>,std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>,std::_Select1st<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>,std::less<std::variant<kernel::Warning,node::Warning>>,std::allocator<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>>
          ::
          _M_insert_unique<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>
                    ((_Rb_tree<std::variant<kernel::Warning,node::Warning>,std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>,std::_Select1st<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>,std::less<std::variant<kernel::Warning,node::Warning>>,std::allocator<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>>
                      *)&this->m_warnings,&local_70);
  bilingual_str::~bilingual_str(&local_70.second);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock0.super_unique_lock);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    CClientUIInterface::NotifyAlertChanged((CClientUIInterface *)&uiInterface);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)(pVar1.second & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Warnings::Set(warning_type id, bilingual_str message)
{
    const auto& [_, inserted]{WITH_LOCK(m_mutex, return m_warnings.insert({id, std::move(message)}))};
    if (inserted) uiInterface.NotifyAlertChanged();
    return inserted;
}